

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  pointer psVar1;
  pointer psVar2;
  int iVar3;
  TrackerContext *pTVar4;
  long lVar5;
  long lVar6;
  pointer psVar7;
  string local_70;
  ReusableStringStream local_50;
  SourceLineInfo local_38;
  
  pTVar4 = this->m_ctx;
  while ((TrackerBase *)pTVar4->m_currentTracker != this) {
    (*(((TrackerBase *)pTVar4->m_currentTracker)->super_ITracker)._vptr_ITracker[8])();
    pTVar4 = this->m_ctx;
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_38.file =
         "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/external/Catch2/single_include/catch2/catch.hpp"
    ;
    local_38.line = 0x3890;
    Catch::operator<<(local_50.m_oss,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_50.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss,"Illogical state: ",0x11);
    std::ostream::operator<<(local_50.m_oss,this->m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_70);
  case Executing:
    goto switchD_001315d4_caseD_1;
  case ExecutingChildren:
    psVar7 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)psVar1 - (long)psVar7;
    if (0 < lVar5 >> 6) {
      lVar6 = (lVar5 >> 6) + 1;
      psVar2 = psVar7 + 2;
      do {
        psVar7 = psVar2;
        iVar3 = (*(psVar7[-2].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar3 == '\0') {
          psVar7 = psVar7 + -2;
          goto LAB_001316a0;
        }
        iVar3 = (*(psVar7[-1].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar3 == '\0') {
          psVar7 = psVar7 + -1;
          goto LAB_001316a0;
        }
        iVar3 = (*((psVar7->
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar3 == '\0') goto LAB_001316a0;
        iVar3 = (*(psVar7[1].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar3 == '\0') {
          psVar7 = psVar7 + 1;
          goto LAB_001316a0;
        }
        lVar6 = lVar6 + -1;
        lVar5 = lVar5 + -0x40;
        psVar2 = psVar7 + 4;
      } while (1 < lVar6);
      psVar7 = psVar7 + 2;
    }
    lVar5 = lVar5 >> 4;
    if (lVar5 == 1) {
LAB_0013167f:
      iVar3 = (*((psVar7->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar3 != '\0') {
        psVar7 = psVar1;
      }
    }
    else if (lVar5 == 2) {
LAB_0013166e:
      iVar3 = (*((psVar7->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar3 != '\0') {
        psVar7 = psVar7 + 1;
        goto LAB_0013167f;
      }
    }
    else {
      if (lVar5 != 3) goto switchD_001315d4_caseD_1;
      iVar3 = (*((psVar7->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar3 != '\0') {
        psVar7 = psVar7 + 1;
        goto LAB_0013166e;
      }
    }
LAB_001316a0:
    if (psVar7 != psVar1) goto switchD_001315d4_caseD_3;
switchD_001315d4_caseD_1:
    this->m_runState = CompletedSuccessfully;
switchD_001315d4_caseD_3:
    pTVar4 = this->m_ctx;
    pTVar4->m_currentTracker = this->m_parent;
    pTVar4->m_runState = CompletedCycle;
    return (int)pTVar4;
  case NeedsAnotherRun:
    goto switchD_001315d4_caseD_3;
  default:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_38.file =
         "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/external/Catch2/single_include/catch2/catch.hpp"
    ;
    local_38.line = 0x3893;
    Catch::operator<<(local_50.m_oss,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_50.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_50.m_oss,"Unknown state: ",0xf);
    std::ostream::operator<<(local_50.m_oss,this->m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_70);
  }
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }